

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprFor * AnalyzeFor(ExpressionContext *ctx,SynFor *syntax)

{
  IntrusiveList<ExprBase> expressions;
  SynBlock *syntax_00;
  ExprBase *pEVar1;
  SynBase *source;
  FunctionData *onwerFunction;
  ExprBase *node;
  ExprBlock *this;
  ExprFor *this_00;
  ExprBase *local_90;
  ExprBase *local_80;
  ExprBlock *block;
  ExprBase *closures;
  IntrusiveList<ExprBase> iteration;
  ExprBase *body;
  ExprBase *increment;
  ExprBase *condition;
  SynBlock *block_1;
  ExprBase *initializer;
  SynFor *syntax_local;
  ExpressionContext *ctx_local;
  
  ExpressionContext::PushLoopScope(ctx,false,false);
  syntax_00 = getType<SynBlock>(syntax->initializer);
  if (syntax_00 == (SynBlock *)0x0) {
    if (syntax->initializer == (SynBase *)0x0) {
      block_1 = (SynBlock *)ExpressionContext::get<ExprVoid>(ctx);
      ExprVoid::ExprVoid((ExprVoid *)block_1,&syntax->super_SynBase,ctx->typeVoid);
    }
    else {
      block_1 = (SynBlock *)AnalyzeStatement(ctx,syntax->initializer);
    }
  }
  else {
    block_1 = (SynBlock *)AnalyzeBlock(ctx,syntax_00,false);
  }
  pEVar1 = AnalyzeExpression(ctx,syntax->condition);
  pEVar1 = CreateConditionCast(ctx,pEVar1->source,pEVar1);
  ctx->scope->breakDepth = ctx->scope->breakDepth + 1;
  ctx->scope->contiueDepth = ctx->scope->contiueDepth + 1;
  if (syntax->increment == (SynBase *)0x0) {
    local_80 = &ExpressionContext::get<ExprVoid>(ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)local_80,&syntax->super_SynBase,ctx->typeVoid);
  }
  else {
    local_80 = AnalyzeStatement(ctx,syntax->increment);
  }
  if (syntax->body == (SynBase *)0x0) {
    local_90 = &ExpressionContext::get<ExprVoid>(ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)local_90,&syntax->super_SynBase,ctx->typeVoid);
  }
  else {
    local_90 = AnalyzeStatement(ctx,syntax->body);
  }
  iteration.tail = local_90;
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&closures);
  source = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  onwerFunction = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
  node = CreateBlockUpvalueClose(ctx,source,onwerFunction,ctx->scope);
  if (node != (ExprBase *)0x0) {
    IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&closures,node);
  }
  IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&closures,local_80);
  this = ExpressionContext::get<ExprBlock>(ctx);
  expressions.tail = iteration.head;
  expressions.head = closures;
  ExprBlock::ExprBlock(this,&syntax->super_SynBase,ctx->typeVoid,expressions,(ExprBase *)0x0);
  ExpressionContext::PopScope(ctx,SCOPE_LOOP);
  this_00 = ExpressionContext::get<ExprFor>(ctx);
  ExprFor::ExprFor(this_00,&syntax->super_SynBase,ctx->typeVoid,(ExprBase *)block_1,pEVar1,
                   &this->super_ExprBase,iteration.tail);
  return this_00;
}

Assistant:

ExprFor* AnalyzeFor(ExpressionContext &ctx, SynFor *syntax)
{
	ctx.PushLoopScope(false, false);

	ExprBase *initializer = NULL;

	if(SynBlock *block = getType<SynBlock>(syntax->initializer))
		initializer = AnalyzeBlock(ctx, block, false);
	else if(syntax->initializer)
		initializer = AnalyzeStatement(ctx, syntax->initializer);
	else
		initializer = new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	ctx.scope->breakDepth++;
	ctx.scope->contiueDepth++;

	ExprBase *increment = syntax->increment ? AnalyzeStatement(ctx, syntax->increment) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);
	ExprBase *body = syntax->body ? AnalyzeStatement(ctx, syntax->body) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	IntrusiveList<ExprBase> iteration;

	if(ExprBase *closures = CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope))
		iteration.push_back(closures);

	iteration.push_back(increment);

	ExprBlock *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, iteration, NULL);

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprFor>()) ExprFor(syntax, ctx.typeVoid, initializer, condition, block, body);
}